

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

void aggregate_draw_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  bool bVar1;
  int iVar2;
  uint x_offset_00;
  uint y_offset_00;
  uint uVar3;
  uint uVar4;
  Am_Value *pAVar5;
  Am_Ptr ptr;
  Am_Object local_68;
  Am_State_Store *local_60;
  Am_State_Store *state;
  Am_Object local_48;
  Am_Object item;
  Am_Value_List components;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *self_local;
  
  pAVar5 = Am_Object::Get(self,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  x_offset_00 = iVar2 + x_offset;
  pAVar5 = Am_Object::Get(self,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  y_offset_00 = iVar2 + y_offset;
  pAVar5 = Am_Object::Get(self,0x66,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x67,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar5);
  if ((uVar3 != 0) && (uVar4 != 0)) {
    (*drawonable->_vptr_Am_Drawonable[0x21])
              (drawonable,(ulong)x_offset_00,(ulong)y_offset_00,(ulong)uVar3,(ulong)uVar4);
    pAVar5 = Am_Object::Get(self,0x82,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)&item,pAVar5);
    Am_Object::Am_Object(&local_48);
    Am_Value_List::Start((Am_Value_List *)&item);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar5 = Am_Value_List::Get((Am_Value_List *)&item);
      Am_Object::operator=(&local_48,pAVar5);
      pAVar5 = Am_Object::Get(&local_48,0x7d8,0);
      ptr = Am_Value::operator_cast_to_void_(pAVar5);
      local_60 = Am_State_Store::Narrow(ptr);
      bVar1 = Am_State_Store::Visible(local_60,drawonable,x_offset_00,y_offset_00);
      if (bVar1) {
        Am_Object::Am_Object(&local_68,&local_48);
        Am_Draw(&local_68,drawonable,x_offset_00,y_offset_00);
        Am_Object::~Am_Object(&local_68);
      }
      Am_Value_List::Next((Am_Value_List *)&item);
    }
    (*drawonable->_vptr_Am_Drawonable[0x22])();
    Am_Object::~Am_Object(&local_48);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&item);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, aggregate_draw,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  if (width && height) {
    drawonable->Push_Clip(left, top, width, height);
    //// DEBUG
    //std::cout << "aggregate " << *self << " clip mask <l" << left << " t" << top
    //     << " w" << width << " h" << height << ">" <<std::endl;
    Am_Value_List components = self.Get(Am_GRAPHICAL_PARTS);
    Am_Object item;
    for (components.Start(); !components.Last(); components.Next()) {
      item = components.Get();
      Am_State_Store *state = Am_State_Store::Narrow(item.Get(Am_PREV_STATE));
      if (state->Visible(drawonable, left, top))
        Am_Draw(item, drawonable, left, top);
    }
    drawonable->Pop_Clip();
  }
}